

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

int __thiscall Arcflow::init(Arcflow *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  runtime_error *this_00;
  size_t in_RCX;
  void *__buf;
  char _error_msg_ [256];
  ssize_t sVar3;
  
  if (this->ready != false) {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x62);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
    goto LAB_00108805;
  }
  bVar1 = check_ext((char *)ctx,".vbp");
  if (bVar1) {
    Instance::Instance((Instance *)_error_msg_,(char *)ctx);
    init(this,(EVP_PKEY_CTX *)_error_msg_);
LAB_001086fd:
    Instance::~Instance((Instance *)_error_msg_);
    iVar2 = extraout_EAX;
  }
  else {
    bVar1 = check_ext((char *)ctx,".mvp");
    if (bVar1) {
      Instance::Instance((Instance *)_error_msg_,(char *)ctx);
      init(this,(EVP_PKEY_CTX *)_error_msg_);
      goto LAB_001086fd;
    }
    bVar1 = check_ext((char *)ctx,".afg");
    if (!bVar1) {
      snprintf(_error_msg_,0x100,"Error: `%s` in \"%s\" line %d","Invalid file extension",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x6a);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,_error_msg_);
      goto LAB_00108805;
    }
    sVar3 = read(this,(int)ctx,__buf,in_RCX);
    iVar2 = (int)sVar3;
  }
  if (this->ready != false) {
    return iVar2;
  }
  snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == true",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x6c);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,_error_msg_);
LAB_00108805:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::init(const char *fname) {
	throw_assert(ready == false);
	if (check_ext(fname, ".vbp")) {
		init(Instance(fname));
	} else if (check_ext(fname, ".mvp")) {
		init(Instance(fname));
	} else if (check_ext(fname, ".afg")) {
		read(fname);
	} else {
		throw_error("Invalid file extension");
	}
	throw_assert(ready == true);
}